

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O3

uint8_t __thiscall ki::protocol::dml::MessageTemplate::get_access_level(MessageTemplate *this)

{
  Record *this_00;
  uint8_t uVar1;
  Field<unsigned_char> *pFVar2;
  string local_38;
  
  this_00 = this->m_record;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"_MsgAccessLvl","");
  pFVar2 = ki::dml::Record::get_field<unsigned_char>(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (pFVar2 == (Field<unsigned_char> *)0x0) {
    uVar1 = '\0';
  }
  else {
    uVar1 = pFVar2->m_value;
  }
  return uVar1;
}

Assistant:

uint8_t MessageTemplate::get_access_level() const
	{
		const auto field = m_record->get_field<ki::dml::UBYT>("_MsgAccessLvl");
		if (field)
			return field->get_value();
		return 0;
	}